

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  char cVar1;
  word wVar2;
  uint nWords;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint *puVar11;
  uint uVar12;
  word *pwVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  word *pwVar20;
  ulong uVar21;
  bool bVar22;
  uint uCanonPhase;
  int pStoreIn [17];
  uint local_8c [7];
  int aiStack_70 [14];
  long local_38;
  
  uVar12 = 1 << ((byte)(nVars + -6) & 0x1f);
  nWords = 1;
  if (6 < nVars) {
    nWords = uVar12;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                  ,0x1e2,"unsigned int Abc_TtSemiCanonicize(word *, int, char *, int *)");
  }
  uVar21 = (ulong)(uint)nVars;
  if (0 < nVars) {
    uVar3 = 0;
    do {
      pCanonPerm[uVar3] = (char)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar21 != uVar3);
  }
  uVar14 = 0;
  uVar3 = (ulong)nWords;
  iVar16 = 0;
  if (0 < (int)nWords) {
    uVar4 = 0;
    iVar16 = 0;
    do {
      uVar7 = pTruth[uVar4];
      if (uVar7 != 0) {
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
        uVar7 = (uVar7 >> 8) + uVar7;
        lVar10 = (uVar7 >> 0x10) + uVar7;
        iVar16 = iVar16 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if ((int)(nWords * 0x20) < iVar16) {
    if (0 < (int)nWords) {
      uVar4 = 0;
      do {
        pTruth[uVar4] = ~pTruth[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    iVar16 = nWords * 0x40 - iVar16;
    uVar14 = 1 << ((byte)nVars & 0x1f);
  }
  if (nVars < 7) {
    if (0 < nVars) {
      uVar4 = *pTruth;
      puVar11 = local_8c;
      lVar10 = 0;
      do {
        puVar11 = (uint *)((long)puVar11 + 4);
        uVar7 = *(ulong *)((long)s_Truths6Neg + lVar10) & uVar4;
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
        uVar7 = (uVar7 >> 8) + uVar7;
        lVar19 = (uVar7 >> 0x10) + uVar7;
        *puVar11 = (int)((ulong)lVar19 >> 0x20) + (int)lVar19 & 0xff;
        lVar10 = lVar10 + 8;
      } while (uVar21 * 8 - lVar10 != 0);
    }
  }
  else {
    memset(local_8c + 1,0,uVar21 * 4);
    if (nVars + -6 != 0x1f) {
      local_38 = (long)(int)uVar12;
      lVar10 = 0;
      do {
        uVar4 = pTruth[lVar10];
        uVar7 = pTruth[lVar10 + 1];
        pwVar13 = s_Truths6Neg;
        lVar19 = 0;
        do {
          uVar5 = (*pwVar13 & uVar7) << ((byte)(1 << ((byte)lVar19 & 0x1f)) & 0x3f) |
                  *pwVar13 & uVar4;
          if (uVar5 != 0) {
            uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
            uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
            uVar5 = (uVar5 >> 8) + uVar5;
            lVar8 = (uVar5 >> 0x10) + uVar5;
            local_8c[lVar19 + 1] =
                 local_8c[lVar19 + 1] + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
          }
          lVar19 = lVar19 + 1;
          pwVar13 = pwVar13 + 1;
        } while (lVar19 != 6);
        if (uVar4 != 0) {
          uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
          uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
          uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
          uVar4 = (uVar4 >> 8) + uVar4;
          lVar19 = (uVar4 >> 0x10) + uVar4;
          lVar8 = 0;
          do {
            if (((uint)lVar10 >> ((uint)lVar8 & 0x1f) & 1) == 0) {
              aiStack_70[lVar8] =
                   aiStack_70[lVar8] + ((int)((ulong)lVar19 >> 0x20) + (int)lVar19 & 0xffU);
            }
            lVar8 = lVar8 + 1;
          } while (uVar21 - 6 != lVar8);
        }
        if (uVar7 != 0) {
          uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
          uVar4 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
          uVar4 = (uVar4 >> 8) + uVar4;
          lVar19 = (uVar4 >> 0x10) + uVar4;
          lVar8 = 0;
          do {
            if ((((uint)lVar10 | 1) >> ((uint)lVar8 & 0x1f) & 1) == 0) {
              aiStack_70[lVar8] =
                   aiStack_70[lVar8] + ((int)((ulong)lVar19 >> 0x20) + (int)lVar19 & 0xffU);
            }
            lVar8 = lVar8 + 1;
          } while (uVar21 - 6 != lVar8);
        }
        lVar10 = lVar10 + 2;
      } while (lVar10 < local_38);
    }
  }
  local_8c[(long)nVars + 1] = iVar16;
  if (0 < nVars) {
    uVar4 = 0;
    do {
      iVar17 = iVar16 - local_8c[uVar4 + 1];
      if ((int)local_8c[uVar4 + 1] < iVar17) {
        if (nWords == 1) {
          bVar6 = (byte)(1 << ((byte)uVar4 & 0x1f));
          *pTruth = (s_Truths6[uVar4] & *pTruth) >> (bVar6 & 0x3f) |
                    *pTruth << (bVar6 & 0x3f) & s_Truths6[uVar4];
        }
        else if (uVar4 < 6) {
          if (0 < (int)nWords) {
            uVar7 = s_Truths6[uVar4];
            uVar5 = 0;
            do {
              bVar6 = (byte)(1 << ((byte)uVar4 & 0x1f));
              pTruth[uVar5] =
                   (pTruth[uVar5] & uVar7) >> (bVar6 & 0x3f) |
                   pTruth[uVar5] << (bVar6 & 0x3f) & uVar7;
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
        }
        else if (0 < (int)nWords) {
          bVar6 = (byte)(uVar4 - 6);
          uVar12 = 1 << (bVar6 & 0x1f);
          iVar18 = 2 << (bVar6 & 0x1f);
          uVar7 = 1;
          if (1 < (int)uVar12) {
            uVar7 = (ulong)uVar12;
          }
          pwVar13 = pTruth + (int)uVar12;
          pwVar20 = pTruth;
          do {
            if (uVar4 - 6 != 0x1f) {
              uVar5 = 0;
              do {
                wVar2 = pwVar20[uVar5];
                pwVar20[uVar5] = pwVar13[uVar5];
                pwVar13[uVar5] = wVar2;
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
            }
            pwVar20 = pwVar20 + iVar18;
            pwVar13 = pwVar13 + iVar18;
          } while (pwVar20 < pTruth + (int)nWords);
        }
        uVar14 = uVar14 | 1 << ((uint)uVar4 & 0x1f);
        local_8c[uVar4 + 1] = iVar17;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar21);
  }
  if (1 < nVars) {
    uVar4 = 2;
    uVar3 = 0;
    do {
      uVar7 = uVar3 + 1;
      if (uVar3 + 2 < uVar21) {
        uVar5 = uVar4;
        uVar15 = uVar7 & 0xffffffff;
        do {
          uVar9 = uVar5 & 0xffffffff;
          if ((int)local_8c[(long)(int)uVar15 + 1] <= (int)local_8c[uVar5 + 1]) {
            uVar9 = uVar15;
          }
          uVar5 = uVar5 + 1;
          iVar16 = (int)uVar9;
          uVar15 = uVar9;
        } while (uVar21 != uVar5);
      }
      else {
        iVar16 = (int)uVar7;
      }
      iVar17 = local_8c[uVar3 + 1];
      iVar18 = local_8c[(long)iVar16 + 1];
      if (iVar18 < iVar17) {
        cVar1 = pCanonPerm[uVar3];
        pCanonPerm[uVar3] = pCanonPerm[iVar16];
        pCanonPerm[iVar16] = cVar1;
        local_8c[uVar3 + 1] = iVar18;
        local_8c[(long)iVar16 + 1] = iVar17;
        uVar14 = uVar14 ^ (1 << ((byte)iVar16 & 0x1f) ^ 1 << ((uint)uVar3 & 0x1f)) &
                          -((uVar14 >> ((byte)iVar16 & 0x1f) ^ uVar14 >> ((byte)uVar3 & 0x1f)) & 1);
        Abc_TtSwapVars(pTruth,nVars,(uint)uVar3,iVar16);
      }
      uVar4 = uVar4 + 1;
      uVar3 = uVar7;
    } while (uVar7 != nVars - 1);
  }
  local_8c[0] = uVar14;
  iVar16 = 0;
  while( true ) {
    if (nVars < 2) {
      return local_8c[0];
    }
    uVar12 = 0;
    lVar10 = (ulong)(nVars - 2) + 1;
    do {
      if (local_8c[lVar10] == local_8c[lVar10 + 1]) {
        uVar14 = Abc_TtCofactorPerm(pTruth,(int)lVar10 + -1,nWords,
                                    (uint)(local_8c[lVar10] != (int)local_8c[(long)nVars + 1] / 2),
                                    pCanonPerm,local_8c,1);
        uVar12 = uVar12 | uVar14;
      }
      lVar19 = lVar10 + -1;
      bVar22 = 0 < lVar10;
      lVar10 = lVar19;
    } while (lVar19 != 0 && bVar22);
    if (uVar12 == 0) break;
    bVar22 = true;
    if (2 < nVars) {
      uVar12 = 0;
      uVar21 = 1;
      do {
        if (local_8c[uVar21 + 1] == local_8c[uVar21 + 2]) {
          uVar14 = Abc_TtCofactorPerm(pTruth,(int)uVar21,nWords,
                                      (uint)(local_8c[uVar21 + 1] !=
                                            (int)local_8c[(long)nVars + 1] / 2),pCanonPerm,local_8c,
                                      1);
          uVar12 = uVar12 | uVar14;
        }
        uVar21 = uVar21 + 1;
      } while (nVars - 1 != uVar21);
      bVar22 = uVar12 == 0;
    }
    if (bVar22) {
      return local_8c[0];
    }
    iVar16 = iVar16 + 1;
    if (iVar16 == 5) {
      return local_8c[0];
    }
  }
  return local_8c[0];
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}